

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_reflect_has(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSAtom JVar1;
  int iVar2;
  undefined4 in_ECX;
  int64_t in_RDI;
  JSContext *in_R8;
  int ret;
  JSAtom atom;
  JSValue in_stack_00000000;
  JSValue prop;
  JSValue obj;
  JSAtom in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffffb0;
  JSValueUnion local_30;
  int64_t local_28;
  JSAtom in_stack_fffffffffffffff4;
  JSContext *in_stack_fffffffffffffff8;
  
  if ((int)(in_R8->header).link.prev == -1) {
    val.u._4_4_ = in_ECX;
    val.u.int32 = in_stack_ffffffffffffffb0;
    val.tag = in_RDI;
    JVar1 = JS_ValueToAtom(in_R8,val);
    if (JVar1 == 0) {
      local_30.ptr = (void *)(local_30 << 0x20);
      local_28 = 6;
    }
    else {
      iVar2 = JS_HasProperty(in_stack_fffffffffffffff8,in_stack_00000000,in_stack_fffffffffffffff4);
      JS_FreeAtom((JSContext *)CONCAT44(JVar1,iVar2),in_stack_ffffffffffffff7c);
      if (iVar2 < 0) {
        local_30.ptr = (void *)(local_30 << 0x20);
        local_28 = 6;
      }
      else {
        local_30.int32._1_3_ = 0;
        local_30.int32._0_1_ = iVar2 != 0;
        local_30._4_4_ = in_stack_fffffffffffffff4;
        local_28 = 1;
      }
    }
  }
  else {
    _local_30 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1bcf40);
  }
  return _local_30;
}

Assistant:

static JSValue js_reflect_has(JSContext *ctx, JSValueConst this_val,
                              int argc, JSValueConst *argv)
{
    JSValueConst obj, prop;
    JSAtom atom;
    int ret;

    obj = argv[0];
    prop = argv[1];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT)
        return JS_ThrowTypeErrorNotAnObject(ctx);
    atom = JS_ValueToAtom(ctx, prop);
    if (unlikely(atom == JS_ATOM_NULL))
        return JS_EXCEPTION;
    ret = JS_HasProperty(ctx, obj, atom);
    JS_FreeAtom(ctx, atom);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}